

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_64.h
# Opt level: O2

void fiat_p256_sub(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  uint64_t x2;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = *arg1 - *arg2;
  uVar4 = (ulong)(*arg1 < *arg2);
  uVar5 = uVar4 + arg2[1];
  uVar3 = arg1[1] - uVar5;
  uVar5 = (ulong)(byte)-(-(arg1[1] < uVar5) - CARRY8(uVar4,arg2[1]));
  uVar7 = uVar5 + arg2[2];
  uVar6 = arg1[2] - uVar7;
  uVar4 = arg1[3];
  uVar5 = (ulong)(byte)-(-(arg1[2] < uVar7) - CARRY8(uVar5,arg2[2]));
  uVar8 = uVar5 + arg2[3];
  uVar1 = -(ulong)((bool)-(uVar4 < uVar8) != CARRY8(uVar5,arg2[3]));
  uVar5 = (ulong)CARRY8(uVar2,uVar1);
  uVar7 = (uVar1 & 0xffffffff) + uVar3;
  uVar3 = (ulong)(CARRY8(uVar1 & 0xffffffff,uVar3) || CARRY8(uVar7,uVar5));
  *out1 = uVar2 + uVar1;
  out1[1] = uVar7 + uVar5;
  out1[2] = uVar6 + uVar3;
  out1[3] = (uVar1 & 0xffffffff00000001) + (uVar4 - uVar8) + (ulong)CARRY8(uVar6,uVar3);
  return;
}

Assistant:

static FIAT_P256_FIAT_INLINE void fiat_p256_sub(fiat_p256_montgomery_domain_field_element out1, const fiat_p256_montgomery_domain_field_element arg1, const fiat_p256_montgomery_domain_field_element arg2) {
  uint64_t x1;
  fiat_p256_uint1 x2;
  uint64_t x3;
  fiat_p256_uint1 x4;
  uint64_t x5;
  fiat_p256_uint1 x6;
  uint64_t x7;
  fiat_p256_uint1 x8;
  uint64_t x9;
  uint64_t x10;
  fiat_p256_uint1 x11;
  uint64_t x12;
  fiat_p256_uint1 x13;
  uint64_t x14;
  fiat_p256_uint1 x15;
  uint64_t x16;
  fiat_p256_uint1 x17;
  fiat_p256_subborrowx_u64(&x1, &x2, 0x0, (arg1[0]), (arg2[0]));
  fiat_p256_subborrowx_u64(&x3, &x4, x2, (arg1[1]), (arg2[1]));
  fiat_p256_subborrowx_u64(&x5, &x6, x4, (arg1[2]), (arg2[2]));
  fiat_p256_subborrowx_u64(&x7, &x8, x6, (arg1[3]), (arg2[3]));
  fiat_p256_cmovznz_u64(&x9, x8, 0x0, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x10, &x11, 0x0, x1, x9);
  fiat_p256_addcarryx_u64(&x12, &x13, x11, x3, (x9 & UINT32_C(0xffffffff)));
  fiat_p256_addcarryx_u64(&x14, &x15, x13, x5, 0x0);
  fiat_p256_addcarryx_u64(&x16, &x17, x15, x7, (x9 & UINT64_C(0xffffffff00000001)));
  out1[0] = x10;
  out1[1] = x12;
  out1[2] = x14;
  out1[3] = x16;
}